

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_chunk_init(uchar **chunk,ucvector *out,size_t length,char *type)

{
  int iVar1;
  uint uVar2;
  void *in_RCX;
  size_t in_RDX;
  long *in_RSI;
  long *in_RDI;
  size_t new_length;
  size_t in_stack_ffffffffffffffc8;
  ucvector *p;
  uint local_4;
  
  p = (ucvector *)in_RSI[1];
  iVar1 = lodepng_addofl((size_t)p,in_RDX,(size_t *)&stack0xffffffffffffffd0);
  if (iVar1 == 0) {
    iVar1 = lodepng_addofl((size_t)p,0xc,(size_t *)&stack0xffffffffffffffd0);
    if (iVar1 == 0) {
      uVar2 = ucvector_resize(p,in_stack_ffffffffffffffc8);
      if (uVar2 == 0) {
        local_4 = 0x53;
      }
      else {
        *in_RDI = (long)p + (*in_RSI - in_RDX) + -0xc;
        lodepng_set32bitInt((uchar *)*in_RDI,(uint)in_RDX);
        lodepng_memcpy((void *)(*in_RDI + 4),in_RCX,4);
        local_4 = 0;
      }
    }
    else {
      local_4 = 0x4d;
    }
  }
  else {
    local_4 = 0x4d;
  }
  return local_4;
}

Assistant:

static unsigned lodepng_chunk_init(unsigned char** chunk,
                                   ucvector* out,
                                   size_t length, const char* type) {
  size_t new_length = out->size;
  if(lodepng_addofl(new_length, length, &new_length)) return 77;
  if(lodepng_addofl(new_length, 12, &new_length)) return 77;
  if(!ucvector_resize(out, new_length)) return 83; /*alloc fail*/
  *chunk = out->data + new_length - length - 12u;

  /*1: length*/
  lodepng_set32bitInt(*chunk, (unsigned)length);

  /*2: chunk name (4 letters)*/
  lodepng_memcpy(*chunk + 4, type, 4);

  return 0;
}